

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcArbitraryClosedProfileDef::~IfcArbitraryClosedProfileDef
          (IfcArbitraryClosedProfileDef *this)

{
  IfcProfileDef::~IfcProfileDef(&this->super_IfcProfileDef,&PTR_construction_vtable_24__007b54e0);
  return;
}

Assistant:

IfcArbitraryClosedProfileDef() : Object("IfcArbitraryClosedProfileDef") {}